

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifcstr(bifcxdef *ctx,char *buf,size_t bufsiz,uchar *str)

{
  long lVar1;
  byte *pbVar2;
  byte bVar3;
  
  lVar1 = (ulong)*(ushort *)str - 2;
  pbVar2 = str + 2;
  do {
    if ((lVar1 == 0) || (bufsiz == 0)) goto LAB_00121bee;
    bVar3 = *pbVar2;
    if (bVar3 == 0x5c) {
      lVar1 = lVar1 + -1;
      if (lVar1 == 0) {
        *buf = 0x5c;
        buf = (char *)((byte *)buf + 1);
        bufsiz = bufsiz - 1;
LAB_00121bee:
        if (bufsiz != 0) {
          *buf = 0;
          return;
        }
        ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
        runsign(ctx->bifcxrun,0x40e);
      }
      pbVar2 = pbVar2 + 1;
      bVar3 = *pbVar2;
      if (1 < bVar3 - 0x28) {
        if (bVar3 == 0x6e) {
          bVar3 = 10;
        }
        else if (bVar3 == 0x74) {
          bVar3 = 9;
        }
        goto LAB_00121bd4;
      }
    }
    else {
LAB_00121bd4:
      *buf = bVar3;
      buf = (char *)((byte *)buf + 1);
      bufsiz = bufsiz - 1;
    }
    pbVar2 = pbVar2 + 1;
    lVar1 = lVar1 + -1;
  } while( true );
}

Assistant:

static void bifcstr(bifcxdef *ctx, char *buf, size_t bufsiz, uchar *str)
{
    size_t  srcrem;
    size_t  dstrem;
    uchar  *src;
    char   *dst;

    /* get the length and text portion of the string */
    srcrem = osrp2(str) - 2;
    str += 2;

    /* scan the string, and convert escapes */
    for (src = str, dst = buf, dstrem = bufsiz ;
         srcrem != 0 && dstrem != 0 ; ++src, --srcrem)
    {
        /* if we have an escape sequence, convert it */
        if (*src == '\\')
        {
            /* skip the backslash in the input */
            ++src;
            --srcrem;

            /* if there's nothing left, store the backslash */
            if (srcrem == 0)
            {
                /* store the backslash */
                *dst++ = '\\';
                --dstrem;

                /* there's nothing left to scan */
                break;
            }

            /* see what the second half of the escape sequence is */
            switch(*src)
            {
            case 'n':
                /* store a C-style newline character */
                *dst++ = '\n';
                --dstrem;
                break;

            case 't':
                /* store a C-style tab */
                *dst++ = '\t';
                --dstrem;
                break;

            case '(':
            case ')':
                /* entirely omit the highlighting sequences */
                break;

            default:
                /* store everything else unchanged */
                *dst++ = *src;
                --dstrem;
                break;
            }
        }
        else
        {
            /* copy this character unchanged */
            *dst++ = *src;
            --dstrem;
        }
    }

    /* if the buffer wasn't big enough, signal an error */
    if (dstrem == 0)
        runsig(ctx->bifcxrun, ERR_BIFCSTR);

    /* null-terminate the result string */
    *dst = '\0';
}